

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct_write_object
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,
                           "private void writeObject(java.io.ObjectOutputStream out) throws java.io.IOException {"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  try {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,
                           "    write(new org.apache.thrift.protocol.TCompactProtocol(new org.apache.thrift.transport.TIOStreamTransport(out)));"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  } catch (org.apache.thrift.TException te) {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"    throw new java.io.IOException(te");
  pcVar2 = "";
  if (this->android_legacy_ != false) {
    pcVar2 = ".getMessage()";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,");");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  }");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"}");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_write_object(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out)
      << "private void writeObject(java.io.ObjectOutputStream out) throws java.io.IOException {"
      << endl;
  indent(out) << "  try {" << endl;
  indent(out) << "    write(new org.apache.thrift.protocol.TCompactProtocol(new "
                 "org.apache.thrift.transport.TIOStreamTransport(out)));" << endl;
  indent(out) << "  } catch (org.apache.thrift.TException te) {" << endl;
  indent(out) << "    throw new java.io.IOException(te" << (android_legacy_ ? ".getMessage()" : "")
              << ");" << endl;
  indent(out) << "  }" << endl;
  indent(out) << "}" << endl << endl;
}